

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::visitParamDecl(CheckerVisitor *this,ParamDecl *p)

{
  bool bVar1;
  TreeOp TVar2;
  LiteralKind LVar3;
  Node *this_00;
  CheckerVisitor *this_01;
  ValueRef *name;
  LiteralExpr *this_02;
  ParamDecl *in_RSI;
  SymbolInfo *in_RDI;
  ValueRef *v;
  SymbolInfo *info;
  Expr *dv;
  ParamDecl *in_stack_ffffffffffffffb8;
  ValueRef *in_stack_ffffffffffffffc0;
  TableMember **this_03;
  CheckerVisitor *in_stack_ffffffffffffffd0;
  
  Visitor::visitParamDecl((Visitor *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this_00 = &ParamDecl::defaultValue((ParamDecl *)0x196b6c)->super_Node;
  this_01 = (CheckerVisitor *)
            makeSymbolInfo(in_stack_ffffffffffffffd0,(SymbolKind)((ulong)in_RDI >> 0x20));
  name = makeValueRef(in_stack_ffffffffffffffd0,in_RDI);
  name->state = VRS_UNKNOWN;
  name->expression = (Expr *)0x0;
  ((anon_union_8_11_e67ab339_for_declarator *)&this_01->super_Visitor)->p = in_RSI;
  *(VarScope **)&this_01->statementSimilarityThreshold = in_RDI[2].ownedScope;
  bVar1 = ParamDecl::isVararg(in_RSI);
  *(bool *)((long)&this_01->statementComplexityThreshold + 1) = bVar1;
  if ((this_00 != (Node *)0x0) && (TVar2 = Node::op(this_00), TVar2 == TO_LITERAL)) {
    this_02 = Expr::asLiteral((Expr *)this_00);
    LVar3 = LiteralExpr::kind(this_02);
    if (LVar3 == LK_NULL) {
      name->flagsPositive = name->flagsPositive | 2;
    }
  }
  ValueDecl::name(&in_RSI->super_ValueDecl);
  declareSymbol(in_stack_ffffffffffffffd0,(SQChar *)in_RDI,in_stack_ffffffffffffffc0);
  if ((in_RDI[0x13].kind & SK_FUNCTION) == SK_EXCEPTION) {
    this_03 = &((in_RDI[0xe].declarator.k)->super_TableDecl)._members._vals;
    ValueDecl::name(&in_RSI->super_ValueDecl);
    normalizeParamName(this_01,(SQChar *)name,(SQChar *)in_stack_ffffffffffffffd0);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_03,
               (value_type *)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void CheckerVisitor::visitParamDecl(ParamDecl *p) {
  Visitor::visitParamDecl(p);

  const Expr *dv = p->defaultValue();

  SymbolInfo *info = makeSymbolInfo(SK_PARAM);
  ValueRef *v = makeValueRef(info);
  v->state = VRS_UNKNOWN;
  v->expression = nullptr;
  info->declarator.p = p;
  info->ownedScope = currentScope;
  info->used = p->isVararg();

  if (dv && dv->op() == TO_LITERAL) {
    if (dv->asLiteral()->kind() == LK_NULL) {
      v->flagsPositive |= RT_NULL;
    }
  }

  declareSymbol(p->name(), v);

  assert(currentInfo);
  if (!effectsOnly)
    currentInfo->parameters.push_back(normalizeParamName(p->name()));
}